

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::WriteThrow(CWriter *this)

{
  bool bVar1;
  reference pvVar2;
  Newline local_12;
  Newline local_11;
  CWriter *local_10;
  CWriter *this_local;
  
  local_10 = this;
  bVar1 = std::
          vector<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
          ::empty(&this->try_catch_stack_);
  if (bVar1) {
    (anonymous_namespace)::CWriter::Write<char_const(&)[17],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(char (*) [17])"wasm_rt_throw();",&local_11);
  }
  else {
    pvVar2 = std::
             vector<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
             ::back(&this->try_catch_stack_);
    (anonymous_namespace)::CWriter::
    Write<char_const(&)[6],std::__cxx11::string&,char_const(&)[8],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(char (*) [6])"goto ",&pvVar2->name,(char (*) [8])"_catch;",&local_12
              );
    pvVar2 = std::
             vector<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
             ::back(&this->try_catch_stack_);
    pvVar2->used = true;
  }
  return;
}

Assistant:

void CWriter::WriteThrow() {
  if (try_catch_stack_.empty()) {
    Write("wasm_rt_throw();", Newline());
  } else {
    Write("goto ", try_catch_stack_.back().name, "_catch;", Newline());
    try_catch_stack_.back().used = true;
  }
}